

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithColor.cpp
# Opt level: O2

raw_ostream * __thiscall
llvm::WithColor::error(WithColor *this,raw_ostream *OS,StringRef Prefix,bool DisableColors)

{
  raw_ostream *prVar1;
  StringRef Str;
  WithColor local_28;
  
  Str.Length = Prefix.Data;
  if (Str.Length != (char *)0x0) {
    Str.Data = (char *)OS;
    prVar1 = raw_ostream::operator<<((raw_ostream *)this,Str);
    raw_ostream::operator<<(prVar1,": ");
  }
  WithColor(&local_28,(raw_ostream *)this,Error,Prefix.Length._0_1_);
  prVar1 = raw_ostream::operator<<(local_28.OS,"error: ");
  ~WithColor(&local_28);
  return prVar1;
}

Assistant:

raw_ostream &WithColor::error(raw_ostream &OS, StringRef Prefix,
                              bool DisableColors) {
  if (!Prefix.empty())
    OS << Prefix << ": ";
  return WithColor(OS, HighlightColor::Error, DisableColors).get()
         << "error: ";
}